

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

Fl_Type * __thiscall Fl_Widget_Class_Type::make(Fl_Widget_Class_Type *this)

{
  int iVar1;
  int iVar2;
  Fl_Window_Type *this_00;
  Fl_Window *pFVar3;
  Overlay_Window *this_01;
  Fl_Type *p;
  
  for (p = Fl_Type::current; p != (Fl_Type *)0x0; p = p->parent) {
    iVar2 = (*p->_vptr_Fl_Type[0x24])(p);
    if (iVar2 != 0) {
      iVar2 = (*p->_vptr_Fl_Type[0x17])(p);
      if (iVar2 == 0) goto LAB_0018e762;
      iVar2 = (*p->_vptr_Fl_Type[0x26])(p);
      if (iVar2 == 0) goto LAB_0018e762;
    }
  }
  p = (Fl_Type *)0x0;
LAB_0018e762:
  this_00 = (Fl_Window_Type *)operator_new(0x150);
  Fl_Widget_Type::Fl_Widget_Type((Fl_Widget_Type *)this_00);
  this_00->dx = 0;
  this_00->dy = 0;
  this_00->drag = 0;
  this_00->sr_min_w = 0;
  this_00->sr_min_h = 0;
  this_00->sr_max_w = 0;
  this_00->sr_max_h = 0;
  (this_00->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type = (_func_int **)&PTR_setlabel_00273298
  ;
  *(undefined2 *)&this_00[1].super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type = 0;
  Fl_Type::name((Fl_Type *)this_00,"UserInterface");
  pFVar3 = (Fl_Window *)(this->super_Fl_Window_Type).super_Fl_Widget_Type.o;
  if (pFVar3 == (Fl_Window *)0x0) {
    pFVar3 = (Fl_Window *)operator_new(0xf0);
    Fl_Window::Fl_Window(pFVar3,100,100,(char *)0x0);
    (this->super_Fl_Window_Type).super_Fl_Widget_Type.o = (Fl_Widget *)pFVar3;
    Fl_Group::current((Fl_Group *)0x0);
    pFVar3 = (Fl_Window *)(this->super_Fl_Window_Type).super_Fl_Widget_Type.o;
  }
  iVar1 = gridy;
  iVar2 = gridx;
  pFVar3->minw = gridx;
  pFVar3->minh = iVar1;
  pFVar3->maxw = 0xc00;
  pFVar3->maxh = 0x800;
  pFVar3->dw = iVar2;
  pFVar3->dh = iVar1;
  pFVar3->aspect = 0;
  Fl_Window::size_range_(pFVar3);
  (this_00->super_Fl_Widget_Type).super_Fl_Type.factory = (Fl_Type *)this;
  this_00->drag = 0;
  this_00->numselected = 0;
  this_01 = (Overlay_Window *)operator_new(0x100);
  Overlay_Window::Overlay_Window(this_01,100,100);
  this_01->window = this_00;
  (this_00->super_Fl_Widget_Type).o = (Fl_Widget *)this_01;
  Fl_Type::add((Fl_Type *)this_00,p);
  this_00->modal = '\0';
  this_00->non_modal = '\0';
  *(undefined1 *)((long)&this_00[1].super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type + 1) = 0;
  return (Fl_Type *)this_00;
}

Assistant:

Fl_Type *Fl_Widget_Class_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && (!p->is_decl_block() || (p->is_widget() && p->is_class()))) p = p->parent;
  Fl_Widget_Class_Type *myo = new Fl_Widget_Class_Type();
  myo->name("UserInterface");

  if (!this->o) {// template widget
    this->o = new Fl_Window(100,100);
    Fl_Group::current(0);
  }
  // Set the size ranges for this window; in order to avoid opening the
  // X display we use an arbitrary maximum size...
  ((Fl_Window *)(this->o))->size_range(gridx, gridy,
                                       3072, 2048,
                                       gridx, gridy, 0);
  myo->factory = this;
  myo->drag = 0;
  myo->numselected = 0;
  Overlay_Window *w = new Overlay_Window(100,100);
  w->window = myo;
  myo->o = w;
  myo->add(p);
  myo->modal = 0;
  myo->non_modal = 0;
  myo->wc_relative = 0;

  return myo;
}